

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::TreeEnsembleParameters::SerializeWithCachedSizes
          (TreeEnsembleParameters *this,CodedOutputStream *output)

{
  byte *pbVar1;
  Rep *pRVar2;
  bool bVar3;
  int iVar4;
  Type *value;
  byte *pbVar5;
  uint uVar6;
  int index;
  uint value_00;
  double *a;
  
  iVar4 = (this->nodes_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar4 != 0) {
    index = 0;
    do {
      value = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode>::TypeHandler>
                        (&(this->nodes_).super_RepeatedPtrFieldBase,index);
      google::protobuf::internal::WireFormatLite::WriteMessage(1,&value->super_MessageLite,output);
      index = index + 1;
    } while (iVar4 != index);
  }
  if (this->numpredictiondimensions_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,this->numpredictiondimensions_,output)
    ;
  }
  if ((this->basepredictionvalue_).current_size_ < 1) {
    return;
  }
  if (output->buffer_size_ < 5) {
    google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,0x1a);
    iVar4 = output->buffer_size_;
  }
  else {
    *output->buffer_ = '\x1a';
    output->buffer_ = output->buffer_ + 1;
    iVar4 = output->buffer_size_ + -1;
    output->buffer_size_ = iVar4;
  }
  value_00 = this->_basepredictionvalue_cached_byte_size_;
  if (iVar4 < 5) {
    google::protobuf::io::CodedOutputStream::WriteVarint32SlowPath(output,value_00);
  }
  else {
    pbVar1 = output->buffer_;
    pbVar5 = pbVar1;
    uVar6 = value_00;
    if (0x7f < value_00) {
      do {
        *pbVar5 = (byte)value_00 | 0x80;
        uVar6 = value_00 >> 7;
        pbVar5 = pbVar5 + 1;
        bVar3 = 0x3fff < value_00;
        value_00 = uVar6;
      } while (bVar3);
    }
    *pbVar5 = (byte)uVar6;
    iVar4 = ((int)pbVar5 - (int)pbVar1) + 1;
    output->buffer_ = output->buffer_ + iVar4;
    output->buffer_size_ = output->buffer_size_ - iVar4;
  }
  pRVar2 = (this->basepredictionvalue_).rep_;
  a = pRVar2->elements;
  if (pRVar2 == (Rep *)0x0) {
    a = (double *)0x0;
  }
  google::protobuf::internal::WireFormatLite::WriteDoubleArray
            (a,(this->basepredictionvalue_).current_size_,output);
  return;
}

Assistant:

void TreeEnsembleParameters::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.TreeEnsembleParameters)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.TreeEnsembleParameters.TreeNode nodes = 1;
  for (unsigned int i = 0, n = this->nodes_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, this->nodes(i), output);
  }

  // uint64 numPredictionDimensions = 2;
  if (this->numpredictiondimensions() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->numpredictiondimensions(), output);
  }

  // repeated double basePredictionValue = 3;
  if (this->basepredictionvalue_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(3, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_basepredictionvalue_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteDoubleArray(
      this->basepredictionvalue().data(), this->basepredictionvalue_size(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.TreeEnsembleParameters)
}